

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int open_get_properties(OPEN_HANDLE open,fields *properties_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar3 = 0x846;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&local_1c);
    iVar3 = 0x84e;
    if ((iVar1 == 0) && (iVar3 = 0x854, 9 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(open->composite_value,9);
      iVar3 = 0x85c;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_map(value,properties_value);
        iVar3 = 0x863;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int open_get_properties(OPEN_HANDLE open, fields* properties_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 9)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 9);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_fields(item_value, properties_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}